

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::Clear(CharSet<char16_t> *this,ArenaAllocator *allocator)

{
  CharSetNode *pCVar1;
  
  if ((4 < (this->rep).compact.countPlusOne - 1) &&
     (pCVar1 = (this->rep).full.root, pCVar1 != (CharSetNode *)0x0)) {
    (**pCVar1->_vptr_CharSetNode)();
  }
  (this->rep).compact.countPlusOne = 1;
  (this->rep).compact.cs[0] = 0xffffffff;
  (this->rep).compact.cs[1] = 0xffffffff;
  (this->rep).compact.cs[2] = 0xffffffff;
  (this->rep).compact.cs[3] = 0xffffffff;
  return;
}

Assistant:

void CharSet<char16>::Clear(ArenaAllocator* allocator)
    {
        if (!IsCompact() && rep.full.root != nullptr)
            rep.full.root->FreeSelf(allocator);
        rep.compact.countPlusOne = 1;
        for (int i = 0; i < MaxCompact; i++)
            rep.compact.cs[i] = emptySlot;
    }